

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::GenerateAbortFramesIndexes(HdlcSimulationDataGenerator *this)

{
  int iVar1;
  value_type_conflict1 local_28;
  value_type_conflict1 local_24;
  value_type_conflict1 local_20;
  value_type_conflict1 local_1c;
  value_type_conflict1 local_18;
  value_type_conflict1 local_14;
  HdlcSimulationDataGenerator *local_10;
  HdlcSimulationDataGenerator *this_local;
  
  local_10 = this;
  iVar1 = rand();
  local_14 = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_14);
  iVar1 = rand();
  local_18 = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_18);
  iVar1 = rand();
  local_1c = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_1c);
  iVar1 = rand();
  local_20 = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_20);
  iVar1 = rand();
  local_24 = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_24);
  iVar1 = rand();
  local_28 = iVar1 % 0x32;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mAbortFramesIndexes,&local_28);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::GenerateAbortFramesIndexes()
{
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
}